

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

double __thiscall Matrix<double,_3,_1>::norm(Matrix<double,_3,_1> *this)

{
  double dVar1;
  double *pdVar2;
  int row;
  int col;
  double dVar3;
  
  dVar3 = -1.0;
  if ((0 < this->rows) && (0 < this->cols)) {
    dVar3 = 0.0;
    if (0 < this->rows) {
      row = 0;
      do {
        if (0 < this->cols) {
          col = 0;
          do {
            pdVar2 = operator()(this,row,col);
            dVar1 = *pdVar2;
            pdVar2 = operator()(this,row,col);
            dVar3 = dVar3 + dVar1 * *pdVar2;
            col = col + 1;
          } while (col < this->cols);
        }
        row = row + 1;
      } while (row < this->rows);
    }
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
      return dVar3;
    }
    dVar3 = SQRT(dVar3);
  }
  return dVar3;
}

Assistant:

double Matrix<T, _0, _1>::norm()
{
    if(this->rows <= 0 || this->cols <= 0)
        return -1;
    double sum = 0;
    for(int i = 0; i < rows; ++i)
        for(int j = 0; j < cols; ++j)
            sum += this->operator()(i, j) * this->operator()(i, j);
    return sqrt(sum);
}